

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btDiscreteDynamicsWorld::integrateTransforms(btDiscreteDynamicsWorld *this,btScalar timeStep)

{
  btPersistentManifold *this_00;
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  btTransform *pbVar6;
  btVector3 *pbVar7;
  btTransform *pbVar8;
  btDispatcherInfo *pbVar9;
  btBroadphaseInterface *pbVar10;
  btBroadphaseProxy *pbVar11;
  btPersistentManifold **ppbVar12;
  btRigidBody *this_01;
  btRigidBody *this_02;
  btManifoldPoint *this_03;
  btCollisionWorld *in_RDI;
  btScalar bVar13;
  btScalar bVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 uVar15;
  undefined4 uVar16;
  btVector3 bVar17;
  btVector3 rel_pos1;
  btVector3 rel_pos0;
  btVector3 *pos2;
  btVector3 *pos1;
  btVector3 imp;
  btScalar combinedRestitution;
  btManifoldPoint *pt;
  int p;
  btRigidBody *body1;
  btRigidBody *body0;
  btPersistentManifold *manifold;
  int i_1;
  CProfileSample __profile_2;
  btTransform modifiedPredictedTrans;
  btSphereShape tmpSphere;
  btClosestNotMeConvexResultCallback sweepResults;
  CProfileSample __profile_1;
  btScalar squareMotion;
  btRigidBody *body;
  int i;
  btTransform predictedTrans;
  CProfileSample __profile;
  undefined4 in_stack_fffffffffffffb58;
  btScalar in_stack_fffffffffffffb5c;
  btRigidBody *in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb68 [16];
  undefined1 in_stack_fffffffffffffb78 [16];
  undefined1 auVar18 [16];
  btScalar local_278;
  btScalar bStack_274;
  undefined6 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  int local_1ac;
  int local_18c;
  ConvexResultCallback local_f8 [6];
  btScalar local_98;
  btScalar local_7c;
  btScalar bStack_78;
  undefined8 local_74;
  btScalar local_6c;
  btRigidBody *local_68;
  int local_60;
  btTransform local_50;
  
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_fffffffffffffb60,
             (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  btTransform::btTransform((btTransform *)in_stack_fffffffffffffb60);
  local_60 = 0;
  do {
    iVar5 = local_60;
    iVar4 = btAlignedObjectArray<btRigidBody_*>::size
                      ((btAlignedObjectArray<btRigidBody_*> *)
                       &in_RDI[2].m_dispatchInfo.m_enableSatConvex);
    if (iVar4 <= iVar5) {
      if ((in_RDI[3].m_collisionObjects.m_capacity & 0x1000000) != 0) {
        CProfileSample::CProfileSample
                  ((CProfileSample *)in_stack_fffffffffffffb60,
                   (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        for (local_18c = 0;
            iVar5 = btAlignedObjectArray<btPersistentManifold_*>::size
                              ((btAlignedObjectArray<btPersistentManifold_*> *)
                               &in_RDI[3].m_dispatchInfo.m_useContinuous), local_18c < iVar5;
            local_18c = local_18c + 1) {
          ppbVar12 = btAlignedObjectArray<btPersistentManifold_*>::operator[]
                               ((btAlignedObjectArray<btPersistentManifold_*> *)
                                &in_RDI[3].m_dispatchInfo.m_useContinuous,local_18c);
          this_00 = *ppbVar12;
          btPersistentManifold::getBody0(this_00);
          this_01 = btRigidBody::upcast((btCollisionObject *)
                                        CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ));
          btPersistentManifold::getBody1(this_00);
          this_02 = btRigidBody::upcast((btCollisionObject *)
                                        CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ));
          for (local_1ac = 0; iVar5 = btPersistentManifold::getNumContacts(this_00),
              local_1ac < iVar5; local_1ac = local_1ac + 1) {
            this_03 = btPersistentManifold::getContactPoint(this_00,local_1ac);
            bVar14 = btManifoldResult::calculateCombinedRestitution
                               (&in_stack_fffffffffffffb60->super_btCollisionObject,
                                (btCollisionObject *)
                                CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
            if ((0.0 < bVar14) &&
               ((this_03->m_appliedImpulse != 0.0 || (NAN(this_03->m_appliedImpulse))))) {
              operator-((btVector3 *)in_stack_fffffffffffffb60);
              ::operator*(in_stack_fffffffffffffb68._8_8_,in_stack_fffffffffffffb68._0_8_);
              ::operator*(in_stack_fffffffffffffb68._8_8_,in_stack_fffffffffffffb68._0_8_);
              btManifoldPoint::getPositionWorldOnA(this_03);
              btManifoldPoint::getPositionWorldOnB(this_03);
              pbVar6 = btCollisionObject::getWorldTransform(&this_01->super_btCollisionObject);
              btTransform::getOrigin(pbVar6);
              operator-(in_stack_fffffffffffffb68._8_8_,in_stack_fffffffffffffb68._0_8_);
              uVar15 = extraout_XMM0_Dc;
              uVar16 = extraout_XMM0_Dd;
              pbVar6 = btCollisionObject::getWorldTransform(&this_02->super_btCollisionObject);
              btTransform::getOrigin(pbVar6);
              bVar17 = operator-(in_stack_fffffffffffffb68._8_8_,in_stack_fffffffffffffb68._0_8_);
              auVar18._8_4_ = uVar15;
              auVar18._0_8_ = bVar17.m_floats._8_8_;
              auVar18._12_4_ = uVar16;
              uVar15 = extraout_XMM0_Dc_00;
              uVar16 = extraout_XMM0_Dd_00;
              if (this_01 != (btRigidBody *)0x0) {
                btRigidBody::applyImpulse
                          (auVar18._8_8_,bVar17.m_floats._8_8_,in_stack_fffffffffffffb78._8_8_);
              }
              if (this_02 != (btRigidBody *)0x0) {
                in_stack_fffffffffffffb60 = this_02;
                bVar17 = operator-((btVector3 *)this_02);
                in_stack_fffffffffffffb68._8_4_ = uVar15;
                in_stack_fffffffffffffb68._0_8_ = bVar17.m_floats._8_8_;
                in_stack_fffffffffffffb68._12_4_ = uVar16;
                in_stack_fffffffffffffb78._8_4_ = extraout_XMM0_Dc_01;
                in_stack_fffffffffffffb78._0_8_ = bVar17.m_floats._0_8_;
                in_stack_fffffffffffffb78._12_4_ = extraout_XMM0_Dd_01;
                btRigidBody::applyImpulse
                          (auVar18._8_8_,auVar18._0_8_,in_stack_fffffffffffffb78._8_8_);
              }
            }
          }
        }
        CProfileSample::~CProfileSample((CProfileSample *)0x22a7b0);
      }
      CProfileSample::~CProfileSample((CProfileSample *)0x22a7bd);
      return;
    }
    pbVar6 = (btTransform *)
             btAlignedObjectArray<btRigidBody_*>::operator[]
                       ((btAlignedObjectArray<btRigidBody_*> *)
                        &in_RDI[2].m_dispatchInfo.m_enableSatConvex,local_60);
    local_68 = *(btRigidBody **)(pbVar6->m_basis).m_el[0].m_floats;
    btCollisionObject::setHitFraction(&local_68->super_btCollisionObject,1.0);
    uVar1 = btCollisionObject::isActive(&in_stack_fffffffffffffb60->super_btCollisionObject);
    if (((bool)uVar1) &&
       (uVar2 = btCollisionObject::isStaticOrKinematicObject(&local_68->super_btCollisionObject),
       !(bool)uVar2)) {
      btRigidBody::predictIntegratedTransform
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,(btTransform *)0x229cd1);
      pbVar7 = btTransform::getOrigin(&local_50);
      bVar14 = (btScalar)((ulong)pbVar7 >> 0x20);
      pbVar8 = btCollisionObject::getWorldTransform(&local_68->super_btCollisionObject);
      btTransform::getOrigin(pbVar8);
      bVar17 = operator-(in_stack_fffffffffffffb68._8_8_,in_stack_fffffffffffffb68._0_8_);
      local_74 = bVar17.m_floats._8_8_;
      local_278 = bVar17.m_floats[0];
      bStack_274 = bVar17.m_floats[1];
      local_7c = local_278;
      bStack_78 = bStack_274;
      local_6c = btVector3::length2((btVector3 *)0x229d6e);
      pbVar9 = btCollisionWorld::getDispatchInfo(in_RDI);
      if ((pbVar9->m_useContinuous & 1U) != 0) {
        bVar13 = btCollisionObject::getCcdSquareMotionThreshold(&local_68->super_btCollisionObject);
        if (((bVar13 != 0.0) || (NAN(bVar13))) &&
           (bVar13 = btCollisionObject::getCcdSquareMotionThreshold
                               (&local_68->super_btCollisionObject), bVar13 < local_6c)) {
          CProfileSample::CProfileSample
                    ((CProfileSample *)in_stack_fffffffffffffb60,
                     (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          btRigidBody::getCollisionShape(local_68);
          bVar3 = btCollisionShape::isConvex((btCollisionShape *)0x229e51);
          if (bVar3) {
            gNumClampedCcdMotions = gNumClampedCcdMotions + 1;
            pbVar8 = btCollisionObject::getWorldTransform(&local_68->super_btCollisionObject);
            btTransform::getOrigin(pbVar8);
            btTransform::getOrigin(&local_50);
            pbVar10 = btCollisionWorld::getBroadphase(in_RDI);
            (*pbVar10->_vptr_btBroadphaseInterface[9])();
            btCollisionWorld::getDispatcher(in_RDI);
            btClosestNotMeConvexResultCallback::btClosestNotMeConvexResultCallback
                      (in_stack_fffffffffffffb78._8_8_,in_stack_fffffffffffffb78._0_8_,
                       in_stack_fffffffffffffb68._8_8_,in_stack_fffffffffffffb68._0_8_,
                       (btOverlappingPairCache *)in_stack_fffffffffffffb60,
                       (btDispatcher *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58)
                      );
            btCollisionObject::getCcdSweptSphereRadius(&local_68->super_btCollisionObject);
            btSphereShape::btSphereShape
                      (in_stack_fffffffffffffb68._8_8_,in_stack_fffffffffffffb68._4_4_);
            pbVar9 = btCollisionWorld::getDispatchInfo(in_RDI);
            local_98 = pbVar9->m_allowedCcdPenetration;
            pbVar11 = btRigidBody::getBroadphaseProxy(local_68);
            local_f8[0].m_collisionFilterGroup = pbVar11->m_collisionFilterGroup;
            pbVar11 = btRigidBody::getBroadphaseProxy(local_68);
            local_f8[0].m_collisionFilterMask = pbVar11->m_collisionFilterMask;
            btTransform::btTransform
                      ((btTransform *)in_stack_fffffffffffffb60,
                       (btTransform *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58))
            ;
            pbVar8 = btCollisionObject::getWorldTransform(&local_68->super_btCollisionObject);
            btTransform::getBasis(pbVar8);
            btTransform::setBasis
                      ((btTransform *)in_stack_fffffffffffffb60,
                       (btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58))
            ;
            btCollisionObject::getWorldTransform(&local_68->super_btCollisionObject);
            btCollisionWorld::convexSweepTest
                      ((btCollisionWorld *)
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       (btConvexShape *)in_RDI,(btTransform *)CONCAT44(iVar4,iVar5),pbVar6,
                       (ConvexResultCallback *)
                       CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffdb0)),bVar14);
            bVar3 = btCollisionWorld::ConvexResultCallback::hasHit(local_f8);
            if ((!bVar3) || (1.0 <= local_f8[0].m_closestHitFraction)) {
              bVar3 = false;
            }
            else {
              btCollisionObject::setHitFraction
                        (&local_68->super_btCollisionObject,local_f8[0].m_closestHitFraction);
              btCollisionObject::getHitFraction(&local_68->super_btCollisionObject);
              btRigidBody::predictIntegratedTransform
                        (in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,(btTransform *)0x22a14e
                        );
              btCollisionObject::setHitFraction(&local_68->super_btCollisionObject,0.0);
              btRigidBody::proceedToTransform
                        (in_stack_fffffffffffffb60,
                         (btTransform *)
                         CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
              bVar3 = true;
            }
            btSphereShape::~btSphereShape((btSphereShape *)0x22a209);
            btClosestNotMeConvexResultCallback::~btClosestNotMeConvexResultCallback
                      ((btClosestNotMeConvexResultCallback *)0x22a216);
            if (!bVar3) goto LAB_0022a234;
          }
          else {
LAB_0022a234:
            bVar3 = false;
          }
          CProfileSample::~CProfileSample((CProfileSample *)0x22a24c);
          if (bVar3) goto LAB_0022a28a;
        }
      }
      btRigidBody::proceedToTransform
                (in_stack_fffffffffffffb60,
                 (btTransform *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    }
LAB_0022a28a:
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void	btDiscreteDynamicsWorld::integrateTransforms(btScalar timeStep)
{
	BT_PROFILE("integrateTransforms");
	btTransform predictedTrans;
	for ( int i=0;i<m_nonStaticRigidBodies.size();i++)
	{
		btRigidBody* body = m_nonStaticRigidBodies[i];
		body->setHitFraction(1.f);

		if (body->isActive() && (!body->isStaticOrKinematicObject()))
		{

			body->predictIntegratedTransform(timeStep, predictedTrans);

			btScalar squareMotion = (predictedTrans.getOrigin()-body->getWorldTransform().getOrigin()).length2();



			if (getDispatchInfo().m_useContinuous && body->getCcdSquareMotionThreshold() && body->getCcdSquareMotionThreshold() < squareMotion)
			{
				BT_PROFILE("CCD motion clamping");
				if (body->getCollisionShape()->isConvex())
				{
					gNumClampedCcdMotions++;
#ifdef USE_STATIC_ONLY
					class StaticOnlyCallback : public btClosestNotMeConvexResultCallback
					{
					public:

						StaticOnlyCallback (btCollisionObject* me,const btVector3& fromA,const btVector3& toA,btOverlappingPairCache* pairCache,btDispatcher* dispatcher) :
						  btClosestNotMeConvexResultCallback(me,fromA,toA,pairCache,dispatcher)
						{
						}

					  	virtual bool needsCollision(btBroadphaseProxy* proxy0) const
						{
							btCollisionObject* otherObj = (btCollisionObject*) proxy0->m_clientObject;
							if (!otherObj->isStaticOrKinematicObject())
								return false;
							return btClosestNotMeConvexResultCallback::needsCollision(proxy0);
						}
					};

					StaticOnlyCallback sweepResults(body,body->getWorldTransform().getOrigin(),predictedTrans.getOrigin(),getBroadphase()->getOverlappingPairCache(),getDispatcher());
#else
					btClosestNotMeConvexResultCallback sweepResults(body,body->getWorldTransform().getOrigin(),predictedTrans.getOrigin(),getBroadphase()->getOverlappingPairCache(),getDispatcher());
#endif
					//btConvexShape* convexShape = static_cast<btConvexShape*>(body->getCollisionShape());
					btSphereShape tmpSphere(body->getCcdSweptSphereRadius());//btConvexShape* convexShape = static_cast<btConvexShape*>(body->getCollisionShape());
					sweepResults.m_allowedPenetration=getDispatchInfo().m_allowedCcdPenetration;

					sweepResults.m_collisionFilterGroup = body->getBroadphaseProxy()->m_collisionFilterGroup;
					sweepResults.m_collisionFilterMask  = body->getBroadphaseProxy()->m_collisionFilterMask;
					btTransform modifiedPredictedTrans = predictedTrans;
					modifiedPredictedTrans.setBasis(body->getWorldTransform().getBasis());

					convexSweepTest(&tmpSphere,body->getWorldTransform(),modifiedPredictedTrans,sweepResults);
					if (sweepResults.hasHit() && (sweepResults.m_closestHitFraction < 1.f))
					{

						//printf("clamped integration to hit fraction = %f\n",fraction);
						body->setHitFraction(sweepResults.m_closestHitFraction);
						body->predictIntegratedTransform(timeStep*body->getHitFraction(), predictedTrans);
						body->setHitFraction(0.f);
						body->proceedToTransform( predictedTrans);

#if 0
						btVector3 linVel = body->getLinearVelocity();

						btScalar maxSpeed = body->getCcdMotionThreshold()/getSolverInfo().m_timeStep;
						btScalar maxSpeedSqr = maxSpeed*maxSpeed;
						if (linVel.length2()>maxSpeedSqr)
						{
							linVel.normalize();
							linVel*= maxSpeed;
							body->setLinearVelocity(linVel);
							btScalar ms2 = body->getLinearVelocity().length2();
							body->predictIntegratedTransform(timeStep, predictedTrans);

							btScalar sm2 = (predictedTrans.getOrigin()-body->getWorldTransform().getOrigin()).length2();
							btScalar smt = body->getCcdSquareMotionThreshold();
							printf("sm2=%f\n",sm2);
						}
#else

						//don't apply the collision response right now, it will happen next frame
						//if you really need to, you can uncomment next 3 lines. Note that is uses zero restitution.
						//btScalar appliedImpulse = 0.f;
						//btScalar depth = 0.f;
						//appliedImpulse = resolveSingleCollision(body,(btCollisionObject*)sweepResults.m_hitCollisionObject,sweepResults.m_hitPointWorld,sweepResults.m_hitNormalWorld,getSolverInfo(), depth);


#endif

        				continue;
					}
				}
			}


			body->proceedToTransform( predictedTrans);

		}

	}

	///this should probably be switched on by default, but it is not well tested yet
	if (m_applySpeculativeContactRestitution)
	{
		BT_PROFILE("apply speculative contact restitution");
		for (int i=0;i<m_predictiveManifolds.size();i++)
		{
			btPersistentManifold* manifold = m_predictiveManifolds[i];
			btRigidBody* body0 = btRigidBody::upcast((btCollisionObject*)manifold->getBody0());
			btRigidBody* body1 = btRigidBody::upcast((btCollisionObject*)manifold->getBody1());

			for (int p=0;p<manifold->getNumContacts();p++)
			{
				const btManifoldPoint& pt = manifold->getContactPoint(p);
				btScalar combinedRestitution = btManifoldResult::calculateCombinedRestitution(body0, body1);

				if (combinedRestitution>0 && pt.m_appliedImpulse != 0.f)
				//if (pt.getDistance()>0 && combinedRestitution>0 && pt.m_appliedImpulse != 0.f)
				{
					btVector3 imp = -pt.m_normalWorldOnB * pt.m_appliedImpulse* combinedRestitution;

					const btVector3& pos1 = pt.getPositionWorldOnA();
					const btVector3& pos2 = pt.getPositionWorldOnB();

					btVector3 rel_pos0 = pos1 - body0->getWorldTransform().getOrigin();
					btVector3 rel_pos1 = pos2 - body1->getWorldTransform().getOrigin();

					if (body0)
						body0->applyImpulse(imp,rel_pos0);
					if (body1)
						body1->applyImpulse(-imp,rel_pos1);
				}
			}
		}
	}

}